

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guid_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::GUIDTest_test_guid_string_is_hex_Test::TestBody
          (GUIDTest_test_guid_string_is_hex_Test *this)

{
  byte bVar1;
  char *in_R9;
  int iVar2;
  ulong uVar3;
  AssertHelper AStack_98;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  AssertionResult gtest_ar_;
  GUID guid;
  string string_val;
  string local_48;
  
  iVar2 = 0;
  do {
    if (iVar2 == 1000) {
      return;
    }
    bidfx_public_api::tools::GUID::GUID(&guid);
    bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
    for (uVar3 = 0; uVar3 < string_val._M_string_length; uVar3 = uVar3 + 1) {
      bVar1 = string_val._M_dataplus._M_p[uVar3];
      if ((char)bVar1 < '0') {
LAB_001bdfb9:
        gtest_ar_.success_ = false;
LAB_001bdfc4:
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        testing::Message::Message((Message *)&local_90);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_48,(internal *)&gtest_ar_,
                   (AssertionResult *)
                   "string_val[i] >= \'0\' && string_val[i] <= \'9\' || string_val[i] >= \'A\' && string_val[i] <= \'F\' || string_val[i] >= \'a\' && string_val[i] <= \'f\'"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_98,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/guid_test.cpp"
                   ,0x33,local_48._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&AStack_98,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&AStack_98);
        std::__cxx11::string::~string((string *)&local_48);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_90);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        std::__cxx11::string::~string((string *)&string_val);
        bidfx_public_api::tools::GUID::~GUID(&guid);
        return;
      }
      if (bVar1 < 0x3a) {
LAB_001bdf74:
        gtest_ar_.success_ = true;
      }
      else {
        if (bVar1 < 0x41) goto LAB_001bdfb9;
        if (bVar1 < 0x47) goto LAB_001bdf74;
        if (bVar1 < 0x61) goto LAB_001bdfb9;
        gtest_ar_.success_ = bVar1 < 0x67;
        if (!gtest_ar_.success_) goto LAB_001bdfc4;
      }
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
    }
    std::__cxx11::string::~string((string *)&string_val);
    bidfx_public_api::tools::GUID::~GUID(&guid);
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

TEST_F(GUIDTest, test_guid_string_is_hex)
{
    for (int it = 0; it < 1000; it++)
    {
        GUID guid;
        std::string string_val = guid.ToString();
        for (int i = 0; i < string_val.size(); i++)
        {
            ASSERT_TRUE(string_val[i] >= '0' && string_val[i] <= '9' ||
                        string_val[i] >= 'A' && string_val[i] <= 'F' ||
                        string_val[i] >= 'a' && string_val[i] <= 'f');
        }
    }
}